

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall StatisticsApp::StatisticsApp(StatisticsApp *this,CommandLineOptions *options)

{
  byte bVar1;
  time_t tVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *this_00;
  ostream *extraout_RAX;
  double __x;
  ostream *local_228;
  uint local_1f4;
  string local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream msg;
  ostream local_1a0 [392];
  CommandLineOptions *local_18;
  CommandLineOptions *options_local;
  StatisticsApp *this_local;
  
  local_18 = options;
  options_local = &this->_options;
  CommandLineOptions::CommandLineOptions(&this->_options,options);
  std::ofstream::ofstream((ofstream *)&this->_outputFile);
  this->_outputStream = (ostream *)0x0;
  MultivariateTracker::MultivariateTracker(&this->_tracker,0,&local_18->statisticsOptions);
  Logger::logLevel = (Type)(this->_options).verboseLevel;
  if (local_18->seed == 0) {
    tVar2 = time((time_t *)0x0);
    local_1f4 = (uint)tVar2;
  }
  else {
    local_1f4 = local_18->seed;
  }
  srand(local_1f4);
  pcVar3 = (char *)std::__cxx11::string::c_str((string *)&(this->_options).fileOutput);
  std::ofstream::open((ofstream *)&this->_outputFile,pcVar3,_S_out);
  bVar1 = std::ios::good((ios *)(&this->_outputFile + *(long *)(*(long *)&this->_outputFile + -0x18)
                                ));
  if ((((bVar1 & 1) == 0) &&
      (uVar4 = std::__cxx11::string::empty((string *)&(this->_options).fileOutput), (uVar4 & 1) == 0
      )) && (0 < (int)Logger::logLevel)) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    this_00 = std::operator<<(local_1a0,"Output file failed to open. Writting to standard output.");
    __x = (double)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    Logger::log(__x);
    std::__cxx11::stringstream::str();
    std::operator<<(extraout_RAX,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  bVar1 = std::ios::good((ios *)(&this->_outputFile + *(long *)(*(long *)&this->_outputFile + -0x18)
                                ));
  if ((bVar1 & 1) == 0) {
    local_228 = (ostream *)&std::cout;
  }
  else {
    local_228 = (ostream *)&this->_outputFile;
  }
  this->_outputStream = local_228;
  return;
}

Assistant:

StatisticsApp(CommandLineOptions const & options) :
        _options(options),
        _outputStream(0),
        _tracker(MultivariateTracker(0, options.statisticsOptions))
    {
        Logger::logLevel = (Logger::Level::Type)this->_options.verboseLevel;

        // ==================================================
        // Seed random number generator
        // --------------------------------------------------
        srand((options.seed == 0 ? (unsigned int)time(0) : options.seed));

        // ==================================================
        // Define output stream
        // --------------------------------------------------
        this->_outputFile.open(this->_options.fileOutput.c_str(), std::ios::out);
        if (!this->_outputFile.good() && !this->_options.fileOutput.empty())
        {
            LOG_MESSAGE(Logger::Level::ERROR, "Output file failed to open. Writting to standard output.");
        }
        this->_outputStream = (this->_outputFile.good() ? &this->_outputFile : &std::cout);
    }